

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O2

bool __thiscall test_CECoordinates::test_copy(test_CECoordinates *this)

{
  CECoordinates *lhs;
  CECoordinates *rhs;
  bool bVar1;
  undefined1 uVar2;
  allocator local_115;
  undefined4 local_114;
  CECoordinates gal;
  CECoordinates cirs;
  undefined4 local_b0 [8];
  CECoordinates icrs;
  CECoordinates obs;
  
  lhs = &this->base_icrs_;
  bVar1 = operator==(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CECoordinates._0_4_ = 0x97;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  bVar1 = operator!=(lhs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CECoordinates._0_4_ = 0x98;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  rhs = &this->base_gal_;
  bVar1 = operator==(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CECoordinates._0_4_ = 0x99;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,0,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  bVar1 = operator!=(lhs,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&cirs,"test_copy",(allocator *)&gal);
  icrs._vptr_CECoordinates._0_4_ = 0x9a;
  (**(code **)(*(long *)this + 0x68))(this,bVar1,1,&cirs);
  std::__cxx11::string::~string((string *)&cirs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&gal);
  CECoordinates::CECoordinates(&cirs,&this->base_cirs_);
  bVar1 = operator==(&cirs,&this->base_cirs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&icrs,"test_copy",(allocator *)&obs);
  gal._vptr_CECoordinates._0_4_ = 0x9e;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&icrs);
  std::__cxx11::string::~string((string *)&icrs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&obs);
  CECoordinates::CECoordinates(&icrs,lhs);
  bVar1 = operator==(&icrs,lhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&gal,"test_copy",(allocator *)local_b0);
  obs._vptr_CECoordinates._0_4_ = 0xa2;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&gal);
  std::__cxx11::string::~string((string *)&gal);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_b0);
  CECoordinates::CECoordinates(&gal,rhs);
  bVar1 = operator==(&gal,rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&obs,"test_copy",(allocator *)&local_114);
  local_b0[0] = 0xa6;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,&obs);
  std::__cxx11::string::~string((string *)&obs);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_114);
  CECoordinates::CECoordinates(&obs,&this->base_obs_);
  bVar1 = operator==(&obs,&this->base_obs_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xaa;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  CECoordinates::SetCoordinates(&gal,&icrs);
  bVar1 = operator==(&gal,&icrs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_b0,"test_copy",&local_115);
  local_114 = 0xae;
  (**(code **)(*(long *)this + 0x48))(this,bVar1,local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_115);
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&obs);
  CECoordinates::~CECoordinates(&gal);
  CECoordinates::~CECoordinates(&icrs);
  CECoordinates::~CECoordinates(&cirs);
  return (bool)uVar2;
}

Assistant:

bool test_CECoordinates::test_copy()
{
    // Make sure the equals and not-equals operators work properly
    test_bool((base_icrs_ == base_icrs_), true, __func__, __LINE__);
    test_bool((base_icrs_ != base_icrs_), false, __func__, __LINE__);
    test_bool((base_icrs_ == base_gal_), false, __func__, __LINE__);
    test_bool((base_icrs_ != base_gal_), true, __func__, __LINE__);

    // Copy CIRS
    CECoordinates cirs = base_cirs_;
    test((cirs == base_cirs_), __func__, __LINE__);

    // Copy ICRS
    CECoordinates icrs = base_icrs_;
    test((icrs == base_icrs_), __func__, __LINE__);

    // Copy Galactic
    CECoordinates gal = base_gal_;
    test((gal == base_gal_), __func__, __LINE__);

    // Copy Observed
    CECoordinates obs = base_obs_;
    test((obs == base_obs_), __func__, __LINE__);

    // Copy coordinates directly
    gal.SetCoordinates(icrs);
    test((gal == icrs), __func__, __LINE__);

    return pass();
}